

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[23],unsigned_long&,char_const(&)[4],unsigned_long&>
          (String *__return_storage_ptr__,kj *this,char (*params) [23],unsigned_long *params_1,
          char (*params_2) [4],unsigned_long *params_3)

{
  undefined1 local_a0 [24];
  size_t local_88;
  CappedArray<char,_26UL> local_80;
  CappedArray<char,_26UL> local_58;
  
  local_88 = strlen((char *)this);
  local_a0._16_8_ = this;
  _::Stringifier::operator*(&local_80,(Stringifier *)&_::STR,*(unsigned_long *)*params);
  local_a0._8_8_ = strlen((char *)params_1);
  local_a0._0_8_ = params_1;
  _::Stringifier::operator*(&local_58,(Stringifier *)&_::STR,*(unsigned_long *)params_2);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>>
            (__return_storage_ptr__,(_ *)(local_a0 + 0x10),(ArrayPtr<const_char> *)&local_80,
             (CappedArray<char,_26UL> *)local_a0,(ArrayPtr<const_char> *)&local_58,
             (CappedArray<char,_26UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}